

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_GroupTableAlloc(TA_StringTable **table)

{
  undefined4 *__s;
  undefined8 *in_RDI;
  TA_StringTablePriv *stringTablePriv;
  TA_StringTable *stringTable;
  TA_RetCode local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    __s = (undefined4 *)malloc(0x1c);
    if (__s == (undefined4 *)0x0) {
      *in_RDI = 0;
      local_4 = TA_ALLOC_ERR;
    }
    else {
      memset(__s,0,0x1c);
      __s[6] = 0xa20bb20b;
      *__s = 10;
      *(char ***)(__s + 2) = TA_GroupString;
      *(undefined4 **)(__s + 4) = __s + 6;
      *in_RDI = __s;
      local_4 = TA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

TA_RetCode TA_GroupTableAlloc( TA_StringTable **table )
{
   TA_StringTable *stringTable;
   TA_StringTablePriv *stringTablePriv;

   if( table == NULL )
   {
      return TA_BAD_PARAM;
   }

   stringTable = (TA_StringTable *)TA_Malloc( sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   if( !stringTable )
   {
      *table = NULL;
      return TA_ALLOC_ERR;
   }

   memset( stringTable, 0, sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   stringTablePriv = (TA_StringTablePriv *)(((char *)stringTable)+sizeof(TA_StringTable));
   stringTablePriv->magicNumber = TA_STRING_TABLE_GROUP_MAGIC_NB;

   stringTable->size = TA_NB_GROUP_ID;
   stringTable->string = &TA_GroupString[0];
   stringTable->hiddenData = stringTablePriv;

   /* From this point, TA_FuncTableFree can be safely called. */

   /* Success. Return the table to the caller. */
   *table = stringTable;

   return TA_SUCCESS;
}